

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_map_based.cpp
# Opt level: O0

bool so_5::impl::map_based_subscr_storage::(anonymous_namespace)::
     is_known_mbox_msg_pair<std::map<so_5::impl::map_based_subscr_storage::storage_t::key_t,so_5::impl::map_based_subscr_storage::storage_t::value_t,std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,std::allocator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>,std::_Rb_tree_iterator<std::pair<so_5::impl::map_based_subscr_storage::storage_t::key_t_const,so_5::impl::map_based_subscr_storage::storage_t::value_t>>>
               (map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
                *s,_Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
                   it)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_50;
  _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
  local_48;
  _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
  next;
  _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
  prev;
  mbox_id_t local_30;
  is_same_mbox_msg predicate;
  map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
  *s_local;
  _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
  it_local;
  
  predicate.m_type = (type_index *)s;
  s_local = (map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
             *)it._M_node;
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
                         *)&s_local);
  local_30 = (ppVar2->first).m_mbox_id;
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
                         *)&s_local);
  predicate.m_id = (mbox_id_t)&(ppVar2->first).m_msg_type;
  prev._M_node = (_Base_ptr)
                 std::
                 map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
                 ::begin((map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
                          *)predicate.m_type);
  bVar1 = std::operator!=((_Self *)&s_local,&prev);
  if (bVar1) {
    next._M_node = (_Base_ptr)s_local;
    std::
    _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
    ::operator--(&next);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
             ::operator->(&next);
    bVar1 = is_same_mbox_msg::operator()((is_same_mbox_msg *)&local_30,&ppVar2->first);
    if (bVar1) {
      return true;
    }
  }
  local_48._M_node = (_Base_ptr)s_local;
  std::
  _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
  ::operator++(&local_48);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
       ::end((map<so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t,_std::less<so_5::impl::map_based_subscr_storage::storage_t::key_t>,_std::allocator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>_>
              *)predicate.m_type);
  bVar1 = std::operator!=(&local_48,&local_50);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_so_5::impl::map_based_subscr_storage::storage_t::key_t,_so_5::impl::map_based_subscr_storage::storage_t::value_t>_>
             ::operator->(&local_48);
    it_local._M_node._7_1_ =
         is_same_mbox_msg::operator()((is_same_mbox_msg *)&local_30,&ppVar2->first);
  }
  else {
    it_local._M_node._7_1_ = false;
  }
  return it_local._M_node._7_1_;
}

Assistant:

bool is_known_mbox_msg_pair( M & s, IT it )
		{
			const is_same_mbox_msg predicate{
					it->first.m_mbox_id, it->first.m_msg_type };

			if( it != s.begin() )
				{
					IT prev = it;
					--prev;
					if( predicate( prev->first ) )
						return true;
				}

			IT next = it;
			++next;
			if( next != s.end() )
				return predicate( next->first );

			return false;
		}